

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O0

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<slang::analysis::NonProceduralExprVisitor&>
          (MinTypMaxExpression *this,Result *visitor)

{
  Expression *in_RSI;
  MinTypMaxExpression *in_RDI;
  
  min(in_RDI);
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(in_RSI,(Result *)in_RDI);
  typ(in_RDI);
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(in_RSI,(Result *)in_RDI);
  max(in_RDI);
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(in_RSI,(Result *)in_RDI);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }